

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<unsigned_int>::growAppend
          (QCommonArrayOps<unsigned_int> *this,uint *b,uint *e)

{
  long lVar1;
  bool bVar2;
  QArrayDataPointer<unsigned_int> *old_00;
  uint **in_RDX;
  uint **in_RSI;
  QPodArrayOps<unsigned_int> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<unsigned_int> *c;
  GrowthPosition where;
  QArrayDataPointer<unsigned_int> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    old_00 = (QArrayDataPointer<unsigned_int> *)((long)in_RDX - (long)in_RSI >> 2);
    c = (QCommonArrayOps<unsigned_int> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QArrayDataPointer<unsigned_int> *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<unsigned_int>::QArrayDataPointer
              ((QArrayDataPointer<unsigned_int> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<unsigned_int>,unsigned_int_const*>
                      ((uint **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<unsigned_int>::detachAndGrow(this_00,where,(qsizetype)in_RDI,in_RDX,old_00);
    }
    else {
      QArrayDataPointer<unsigned_int>::detachAndGrow(this_00,where,(qsizetype)in_RDI,in_RDX,old_00);
    }
    QPodArrayOps<unsigned_int>::copyAppend(in_RDI,(uint *)in_RDX,(uint *)old_00);
    QArrayDataPointer<unsigned_int>::~QArrayDataPointer(old_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }